

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue JS_ConcatString3(JSContext *ctx,char *str1,JSValue str2,char *str3)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  JSValueUnion p;
  JSValue JVar4;
  StringBuffer b_s;
  
  if (((int)str2.tag == -7) || (str2 = JS_ToStringFree(ctx,str2), (int)str2.tag != 6)) {
    p = str2.u;
    sVar2 = strlen(str1);
    sVar3 = strlen(str3);
    iVar1 = string_buffer_init2(ctx,&b_s,(*(uint *)((long)p.ptr + 4) & 0x7fffffff) +
                                         (int)sVar3 + (int)sVar2,*(uint *)((long)p.ptr + 4) >> 0x1f)
    ;
    if (iVar1 == 0) {
      string_buffer_write8(&b_s,(uint8_t *)str1,(int)sVar2);
      string_buffer_concat(&b_s,(JSString *)p.ptr,0,*(uint *)((long)p.ptr + 4) & 0x7fffffff);
      string_buffer_write8(&b_s,(uint8_t *)str3,(int)sVar3);
      JS_FreeValue(ctx,str2);
      JVar4 = string_buffer_end(&b_s);
      return JVar4;
    }
  }
  JS_FreeValue(ctx,str2);
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue JS_ConcatString3(JSContext *ctx, const char *str1,
                                JSValue str2, const char *str3)
{
    StringBuffer b_s, *b = &b_s;
    int len1, len3;
    JSString *p;

    if (unlikely(JS_VALUE_GET_TAG(str2) != JS_TAG_STRING)) {
        str2 = JS_ToStringFree(ctx, str2);
        if (JS_IsException(str2))
            goto fail;
    }
    p = JS_VALUE_GET_STRING(str2);
    len1 = strlen(str1);
    len3 = strlen(str3);

    if (string_buffer_init2(ctx, b, len1 + p->len + len3, p->is_wide_char))
        goto fail;

    string_buffer_write8(b, (const uint8_t *)str1, len1);
    string_buffer_concat(b, p, 0, p->len);
    string_buffer_write8(b, (const uint8_t *)str3, len3);

    JS_FreeValue(ctx, str2);
    return string_buffer_end(b);

 fail:
    JS_FreeValue(ctx, str2);
    return JS_EXCEPTION;
}